

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheNewBoolean(xmlXPathContextPtr ctxt,int val)

{
  void *pvVar1;
  long lVar2;
  xmlXPathObjectPtr pxVar3;
  int iVar4;
  xmlXPathObjectPtr ret_1;
  xmlXPathObjectPtr ret;
  xmlXPathContextCachePtr cache;
  int val_local;
  xmlXPathContextPtr ctxt_local;
  
  if ((ctxt != (xmlXPathContextPtr)0x0) && (ctxt->cache != (void *)0x0)) {
    pvVar1 = ctxt->cache;
    if ((*(long *)((long)pvVar1 + 0x10) != 0) && (*(int *)(*(long *)((long)pvVar1 + 0x10) + 8) != 0)
       ) {
      lVar2 = **(long **)((long)pvVar1 + 0x10);
      iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x10) + 8) + -1;
      *(int *)(*(long *)((long)pvVar1 + 0x10) + 8) = iVar4;
      pxVar3 = *(xmlXPathObjectPtr *)(lVar2 + (long)iVar4 * 8);
      pxVar3->type = XPATH_BOOLEAN;
      pxVar3->boolval = (uint)(val != 0);
      return pxVar3;
    }
    if ((*(long *)((long)pvVar1 + 0x20) != 0) && (*(int *)(*(long *)((long)pvVar1 + 0x20) + 8) != 0)
       ) {
      lVar2 = **(long **)((long)pvVar1 + 0x20);
      iVar4 = *(int *)(*(long *)((long)pvVar1 + 0x20) + 8) + -1;
      *(int *)(*(long *)((long)pvVar1 + 0x20) + 8) = iVar4;
      pxVar3 = *(xmlXPathObjectPtr *)(lVar2 + (long)iVar4 * 8);
      pxVar3->type = XPATH_BOOLEAN;
      pxVar3->boolval = (uint)(val != 0);
      return pxVar3;
    }
  }
  pxVar3 = xmlXPathNewBoolean(val);
  return pxVar3;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheNewBoolean(xmlXPathContextPtr ctxt, int val)
{
    if ((ctxt != NULL) && (ctxt->cache)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->booleanObjs != NULL) &&
	    (cache->booleanObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->booleanObjs->items[--cache->booleanObjs->number];
	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_BOOLEAN);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_BOOLEAN;
	    ret->boolval = (val != 0);
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_BOOLEAN);
#endif
	    return(ret);
	}
    }
    return(xmlXPathNewBoolean(val));
}